

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::End(void)

{
  long lVar1;
  ImGuiWindowStackData *pIVar2;
  ImGuiWindow *local_40;
  ImVec2 local_30;
  ImVec2 local_28;
  ImGuiWindow *local_20;
  ImGuiWindow *host_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window = (ImGuiWindow *)GImGui;
  host_window = GImGui->CurrentWindow;
  if (((GImGui->CurrentWindowStack).Size < 2) &&
     ((GImGui->WithinFrameScopeWithImplicitWindow & 1U) != 0)) {
    if ((GImGui->CurrentWindowStack).Size < 2) {
      __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x1c0b,"void ImGui::End()");
    }
  }
  else {
    if ((GImGui->CurrentWindowStack).Size < 1) {
      __assert_fail("g.CurrentWindowStack.Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x1c0e,"void ImGui::End()");
    }
    if (((((host_window->Flags & 0x1000000U) != 0) && ((host_window->Flags & 0x20000000U) == 0)) &&
        ((host_window->field_0x3f9 & 1) == 0)) && ((GImGui->WithinEndChild & 1U) == 0)) {
      __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x1c12,"void ImGui::End()");
    }
    if ((host_window->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
      EndColumns();
    }
    if ((host_window->Flags & 0x20000000U) == 0) {
      PopClipRect();
    }
    if ((host_window->Flags & 0x1000000U) == 0) {
      LogFinish();
    }
    if (((host_window->DockNode != (ImGuiDockNode *)0x0) &&
        (((byte)host_window->field_0x3f9 >> 2 & 1) != 0)) &&
       (local_20 = host_window->DockNode->HostWindow, local_20 != (ImGuiWindow *)0x0)) {
      local_30 = ::operator+(&(host_window->DC).CursorMaxPos,&host_window->WindowPadding);
      local_28 = ::operator-(&local_30,&local_20->WindowPadding);
      (local_20->DC).CursorMaxPos = local_28;
    }
    pIVar2 = ImVector<ImGuiWindowStackData>::back
                       ((ImVector<ImGuiWindowStackData> *)&window[0xe].DockTabItemRect);
    memcpy(&window[0xf].field_0xf0,&pIVar2->ParentLastItemDataBackup,0x3c);
    if ((host_window->Flags & 0x10000000U) != 0) {
      window[0xf].ParentWorkRect.Min.x = (float)((int)window[0xf].ParentWorkRect.Min.x + -1);
    }
    if ((host_window->Flags & 0x4000000U) != 0) {
      ImVector<ImGuiPopupData>::pop_back((ImVector<ImGuiPopupData> *)&window[0xf].WorkRect);
    }
    pIVar2 = ImVector<ImGuiWindowStackData>::back
                       ((ImVector<ImGuiWindowStackData> *)&window[0xe].DockTabItemRect);
    ImGuiStackSizes::CompareWithCurrentState(&pIVar2->StackSizesOnBegin);
    ImVector<ImGuiWindowStackData>::pop_back
              ((ImVector<ImGuiWindowStackData> *)&window[0xe].DockTabItemRect);
    if (window[0xe].DockTabItemRect.Min.x == 0.0) {
      local_40 = (ImGuiWindow *)0x0;
    }
    else {
      pIVar2 = ImVector<ImGuiWindowStackData>::back
                         ((ImVector<ImGuiWindowStackData> *)&window[0xe].DockTabItemRect);
      local_40 = pIVar2->Window;
    }
    SetCurrentWindow(local_40);
    lVar1._0_4_ = window[0xf].WindowClass.ViewportFlagsOverrideClear;
    lVar1._4_4_ = window[0xf].WindowClass.TabItemFlagsOverrideSet;
    if (lVar1 != 0) {
      SetCurrentViewport(*(ImGuiWindow **)&window[0xf].WindowClass.ViewportFlagsOverrideClear,
                         *(ImGuiViewportP **)
                          (*(long *)&window[0xf].WindowClass.ViewportFlagsOverrideClear + 0x30));
    }
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !(window->Flags & ImGuiWindowFlags_DockNodeHost) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.LastItemData = g.CurrentWindowStack.back().ParentLastItemDataBackup;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
        g.BeginMenuCount--;
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    g.CurrentWindowStack.back().StackSizesOnBegin.CompareWithCurrentState();
    g.CurrentWindowStack.pop_back();
    SetCurrentWindow(g.CurrentWindowStack.Size == 0 ? NULL : g.CurrentWindowStack.back().Window);
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}